

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2b88da::BuildSystemFrontendImpl::initialize(BuildSystemFrontendImpl *this)

{
  BuildSystemFrontendDelegate *pBVar1;
  StringRef path;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  int *piVar7;
  pointer pBVar8;
  size_t sVar9;
  undefined8 uVar10;
  FileSystem *pFVar11;
  StringRef path_00;
  StringRef path_01;
  byte local_519;
  Twine local_4f0;
  Twine local_4d8;
  Twine local_4c0;
  char *local_4a8;
  char *local_4a0;
  undefined1 local_498 [8];
  string error_1;
  char *local_470;
  Twine local_468;
  Twine local_450;
  Twine local_438;
  path *local_420;
  StringRef local_410;
  Twine local_400;
  char *local_3e8;
  StringRef local_3d8;
  Twine local_3c8;
  undefined1 local_3b0 [8];
  StringRef dbPath;
  SmallString<256U> tmp;
  Twine local_278;
  Twine local_260;
  StringRef local_248;
  undefined1 local_238 [8];
  string error;
  string local_1f8;
  FileInfo local_1d8;
  string local_188;
  path *local_168;
  undefined1 local_158 [8];
  StringRef dir;
  undefined8 local_140;
  undefined1 local_138 [32];
  Twine local_118;
  Twine local_100;
  Twine local_e8;
  uint local_cc;
  lock_guard<std::mutex> local_c8;
  lock_guard<std::mutex> lock;
  BuildSystemFrontendImpl *this_local;
  int local_c;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_c8,&this->stateMutex);
  std::__atomic_base<unsigned_int>::operator=
            (&(this->delegateImpl->numFailedCommands).super___atomic_base<unsigned_int>,0);
  std::__atomic_base<unsigned_int>::operator=
            (&(this->delegateImpl->numErrors).super___atomic_base<unsigned_int>,0);
  if ((this->cancelled & 1U) == 0) {
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->system);
    if (bVar2) {
      pBVar8 = std::
               unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
               ::operator->(&this->system);
      llbuild::buildsystem::BuildSystem::resetForBuild(pBVar8);
      this_local._7_1_ = 1;
      local_cc = 1;
    }
    else {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        uVar4 = llbuild::basic::sys::chdir(pcVar6);
        if ((uVar4 & 1) == 0) {
          pBVar1 = this->delegate;
          llvm::Twine::Twine(&local_100,"unable to honor --chdir: ");
          piVar7 = __errno_location();
          pcVar6 = strerror(*piVar7);
          llvm::Twine::Twine(&local_118,pcVar6);
          llvm::operator+(&local_e8,&local_100,&local_118);
          llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar1,&local_e8);
          this_local._7_1_ = 0;
          local_cc = 1;
          goto LAB_002afd9c;
        }
      }
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->fileSystem);
      if (bVar2) {
        std::
        make_unique<llbuild::buildsystem::BuildSystem,llbuild::buildsystem::BuildSystemFrontendDelegate&,std::unique_ptr<llbuild::basic::FileSystem,std::default_delete<llbuild::basic::FileSystem>>>
                  ((BuildSystemFrontendDelegate *)local_138,
                   (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                    *)this->delegate);
        std::
        unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
        ::operator=(&this->system,
                    (unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                     *)local_138);
        std::
        unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
        ::~unique_ptr((unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                       *)local_138);
        pBVar8 = std::
                 unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                 ::operator->(&this->system);
        sVar9 = std::__cxx11::string::data();
        dir.Length = sVar9;
        uVar10 = std::__cxx11::string::length();
        local_140 = uVar10;
        bVar2 = llbuild::buildsystem::BuildSystem::loadDescription(pBVar8,stack0xfffffffffffffeb8);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            local_168 = (path *)std::__cxx11::string::data();
            pcVar6 = (char *)std::__cxx11::string::length();
            path_00.Length = 2;
            path_00.Data = pcVar6;
            _local_158 = llvm::sys::path::parent_path(local_168,path_00,(Style)pcVar6);
            pBVar8 = std::
                     unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                     ::operator->(&this->system);
            pFVar11 = llbuild::buildsystem::BuildSystem::getFileSystem(pBVar8);
            llvm::StringRef::operator_cast_to_string(&local_188,(StringRef *)local_158);
            uVar4 = (*pFVar11->_vptr_FileSystem[3])(pFVar11,&local_188);
            local_519 = 0;
            if ((uVar4 & 1) == 0) {
              pBVar8 = std::
                       unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                       ::operator->(&this->system);
              pFVar11 = llbuild::buildsystem::BuildSystem::getFileSystem(pBVar8);
              llvm::StringRef::operator_cast_to_string(&local_1f8,(StringRef *)local_158);
              (*pFVar11->_vptr_FileSystem[7])(&local_1d8,pFVar11,&local_1f8);
              bVar2 = llbuild::basic::FileInfo::isDirectory(&local_1d8);
              local_519 = bVar2 ^ 0xff;
              std::__cxx11::string::~string((string *)&local_1f8);
            }
            std::__cxx11::string::~string((string *)&local_188);
            if ((local_519 & 1) != 0) {
              pBVar1 = this->delegate;
              llvm::operator+((Twine *)((long)&error.field_2 + 8),
                              "unable to create tracing directory: ",(StringRef *)local_158);
              llbuild::buildsystem::BuildSystemFrontendDelegate::error
                        (pBVar1,(Twine *)((long)&error.field_2 + 8));
              std::
              unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
              ::operator=(&this->system,(nullptr_t)0x0);
              this_local._7_1_ = 0;
              local_cc = 1;
              goto LAB_002afd9c;
            }
            std::__cxx11::string::string((string *)local_238);
            pBVar8 = std::
                     unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                     ::operator->(&this->system);
            uVar10 = std::__cxx11::string::data();
            local_248.Data = (char *)uVar10;
            uVar10 = std::__cxx11::string::length();
            local_248.Length = uVar10;
            bVar2 = llbuild::buildsystem::BuildSystem::enableTracing
                              (pBVar8,local_248,(string *)local_238);
            bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
            if (bVar2) {
              pBVar1 = this->delegate;
              llvm::Twine::Twine(&local_278,"unable to enable tracing: ");
              llvm::Twine::Twine((Twine *)(tmp.super_SmallVector<char,_256U>.
                                           super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8),
                                 (string *)local_238);
              llvm::operator+(&local_260,&local_278,
                              (Twine *)(tmp.super_SmallVector<char,_256U>.
                                        super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8));
              llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar1,&local_260);
              std::
              unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
              ::operator=(&this->system,(nullptr_t)0x0);
              this_local._7_1_ = 0;
            }
            local_cc = (uint)bVar2;
            std::__cxx11::string::~string((string *)local_238);
            if (local_cc != 0) goto LAB_002afd9c;
          }
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            llvm::SmallString<256U>::SmallString((SmallString<256U> *)&dbPath.Length);
            local_3b0 = (undefined1  [8])std::__cxx11::string::data();
            dbPath.Data = (char *)std::__cxx11::string::length();
            llvm::Twine::Twine(&local_3c8,&this->invocation->dbPath);
            bVar3 = llvm::sys::path::is_relative(&local_3c8,native);
            bVar2 = false;
            if (bVar3) {
              strlen("://");
              sVar9 = llvm::StringRef::find((StringRef *)local_3b0,local_3d8,0);
              bVar2 = false;
              if (sVar9 == 0xffffffffffffffff) {
                local_3e8 = ":";
                pcVar6 = (char *)strlen(":");
                bVar2 = false;
                if (pcVar6 <= dbPath.Data) {
                  if (pcVar6 == (char *)0x0) {
                    local_c = 0;
                  }
                  else {
                    local_c = memcmp((void *)local_3b0,local_3e8,(size_t)pcVar6);
                  }
                  bVar2 = local_c == 0;
                }
                bVar2 = (bool)(bVar2 ^ 1);
              }
            }
            if (bVar2) {
              local_420 = (path *)std::__cxx11::string::data();
              pcVar6 = (char *)std::__cxx11::string::length();
              path_01.Length = 2;
              path_01.Data = pcVar6;
              local_410 = llvm::sys::path::parent_path(local_420,path_01,(Style)pcVar6);
              llvm::Twine::Twine(&local_400,&local_410);
              llvm::Twine::Twine(&local_438,&this->invocation->dbPath);
              llvm::Twine::Twine(&local_450,"");
              llvm::Twine::Twine(&local_468,"");
              llvm::sys::path::append
                        ((SmallVectorImpl<char> *)&dbPath.Length,&local_400,&local_438,&local_450,
                         &local_468);
              join_0x00000010_0x00000000_ =
                   llvm::SmallString<256U>::str((SmallString<256U> *)&dbPath.Length);
              local_3b0 = (undefined1  [8])error_1.field_2._8_8_;
              dbPath.Data = local_470;
            }
            std::__cxx11::string::string((string *)local_498);
            pBVar8 = std::
                     unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
                     ::operator->(&this->system);
            local_4a8 = (char *)local_3b0;
            local_4a0 = dbPath.Data;
            path.Length = (size_t)dbPath.Data;
            path.Data = (char *)local_3b0;
            bVar2 = llbuild::buildsystem::BuildSystem::attachDB(pBVar8,path,(string *)local_498);
            if (!bVar2) {
              pBVar1 = this->delegate;
              llvm::Twine::Twine(&local_4d8,"unable to attach DB: ");
              llvm::Twine::Twine(&local_4f0,(string *)local_498);
              llvm::operator+(&local_4c0,&local_4d8,&local_4f0);
              llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar1,&local_4c0);
              std::
              unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
              ::operator=(&this->system,(nullptr_t)0x0);
              this_local._7_1_ = 0;
            }
            local_cc = (uint)!bVar2;
            std::__cxx11::string::~string((string *)local_498);
            llvm::SmallString<256U>::~SmallString((SmallString<256U> *)&dbPath.Length);
            if (local_cc != 0) goto LAB_002afd9c;
          }
          this_local._7_1_ = 1;
          local_cc = 1;
        }
        else {
          std::
          unique_ptr<llbuild::buildsystem::BuildSystem,_std::default_delete<llbuild::buildsystem::BuildSystem>_>
          ::operator=(&this->system,(nullptr_t)0x0);
          this_local._7_1_ = 0;
          local_cc = 1;
        }
      }
      else {
        pBVar1 = this->delegate;
        llvm::Twine::Twine((Twine *)(local_138 + 8),"invalid reuse after initialization failure");
        llbuild::buildsystem::BuildSystemFrontendDelegate::error(pBVar1,(Twine *)(local_138 + 8));
        this_local._7_1_ = 0;
        local_cc = 1;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
    local_cc = 1;
  }
LAB_002afd9c:
  std::lock_guard<std::mutex>::~lock_guard(&local_c8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool initialize() {
    std::lock_guard<std::mutex> lock(stateMutex);

    delegateImpl->numFailedCommands = 0;
    delegateImpl->numErrors = 0;

    if (cancelled)
      return false;

    if (system) {
      // Already exists, just reset state
      system->resetForBuild();
      return true;
    }

    if (!invocation.chdirPath.empty()) {
      if (!sys::chdir(invocation.chdirPath.c_str())) {
        delegate.error(Twine("unable to honor --chdir: ") + strerror(errno));
        return false;
      }
    }

    if (!fileSystem) {
      // Catch and report client misuse of a failed build system object
      delegate.error(Twine("invalid reuse after initialization failure"));
      return false;
    }

    // Create the build system.
    system = std::make_unique<BuildSystem>(delegate, std::move(fileSystem));

    // Load the build file.
    if (!system->loadDescription(invocation.buildFilePath)) {
      system = nullptr;
      return false;
    }

    // Enable tracing, if requested.
    if (!invocation.traceFilePath.empty()) {
      const auto dir = llvm::sys::path::parent_path(invocation.traceFilePath);
      if (!system->getFileSystem().createDirectories(dir) &&
          !system->getFileSystem().getFileInfo(dir).isDirectory()) {
        delegate.error(Twine("unable to create tracing directory: " + dir));
        system = nullptr;
        return false;
      }

      std::string error;
      if (!system->enableTracing(invocation.traceFilePath, &error)) {
        delegate.error(Twine("unable to enable tracing: ") + error);
        system = nullptr;
        return false;
      }
    }

    // Attach the database.
    if (!invocation.dbPath.empty()) {
      // If the database path is relative, always make it relative to the input
      // file.
      SmallString<256> tmp;
      StringRef dbPath = invocation.dbPath;
      if (llvm::sys::path::is_relative(invocation.dbPath) &&
          dbPath.find("://") == StringRef::npos && !dbPath.startswith(":")) {
        llvm::sys::path::append(
            tmp, llvm::sys::path::parent_path(invocation.buildFilePath),
            invocation.dbPath);
        dbPath = tmp.str();
      }

      std::string error;
      if (!system->attachDB(dbPath, &error)) {
        delegate.error(Twine("unable to attach DB: ") + error);
        system = nullptr;
        return false;
      }
    }

    return true;
  }